

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O1

int __thiscall ON_PolyEdgeCurve::FindTrim(ON_PolyEdgeCurve *this,ON_BrepTrim *trim)

{
  int iVar1;
  ON_PolyEdgeSegment *pOVar2;
  int iVar3;
  int segment_index;
  bool bVar4;
  
  iVar3 = -1;
  if (trim != (ON_BrepTrim *)0x0) {
    iVar1 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
    if (0 < iVar1) {
      iVar3 = -1;
      segment_index = 0;
      do {
        pOVar2 = SegmentCurve(this,segment_index);
        if ((pOVar2 == (ON_PolyEdgeSegment *)0x0) || (pOVar2->m_trim != trim)) {
          bVar4 = false;
        }
        else {
          bVar4 = true;
          iVar3 = segment_index;
        }
      } while ((!bVar4) &&
              (bVar4 = iVar1 + -1 != segment_index, segment_index = segment_index + 1, bVar4));
    }
  }
  return iVar3;
}

Assistant:

int ON_PolyEdgeCurve::FindTrim( const ON_BrepTrim* trim) const
{
  int rc = -1;
  if ( 0 != trim )
  {
    int i, count = SegmentCount();
    for( i = 0; i < count; i++)
    {
      ON_PolyEdgeSegment* segment = SegmentCurve(i);
      if ( 0 != segment && trim == segment->BrepTrim() )
      {
        rc = i;
        break;
      }
    }
  }
  return rc;
}